

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_shard.c
# Opt level: O1

REF_STATUS ref_shard_cell_add_local(REF_NODE ref_node,REF_CELL ref_cell,REF_INT *nodes)

{
  bool bVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  bool bVar5;
  REF_INT new_cell;
  REF_INT local_14;
  
  if ((long)ref_cell->node_per < 1) {
    uVar4 = 0;
  }
  else {
    lVar3 = 0;
    bVar5 = false;
    do {
      bVar1 = !bVar5;
      bVar5 = true;
      if (bVar1) {
        bVar5 = ref_node->ref_mpi->id == ref_node->part[nodes[lVar3]];
      }
      lVar3 = lVar3 + 1;
    } while (ref_cell->node_per != lVar3);
    uVar4 = 0;
    if (bVar5) {
      uVar2 = ref_cell_add(ref_cell,nodes,&local_14);
      uVar4 = 0;
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
               0x1c6,"ref_shard_cell_add_local",(ulong)uVar2,"add");
        uVar4 = uVar2;
      }
    }
  }
  return uVar4;
}

Assistant:

REF_FCN static REF_STATUS ref_shard_cell_add_local(REF_NODE ref_node,
                                                   REF_CELL ref_cell,
                                                   REF_INT *nodes) {
  REF_BOOL has_local;
  REF_INT node, new_cell;

  has_local = REF_FALSE;

  for (node = 0; node < ref_cell_node_per(ref_cell); node++)
    has_local = has_local || (ref_mpi_rank(ref_node_mpi(ref_node)) ==
                              ref_node_part(ref_node, nodes[node]));

  if (has_local) RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add");

  return REF_SUCCESS;
}